

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

SceneObject * __thiscall
CMU462::DynamicScene::Mesh::get_transformed_static_object(Mesh *this,double t)

{
  double dVar1;
  bool bVar2;
  double *pdVar3;
  SceneObject *pSVar4;
  VertexIter this_00;
  reference this_01;
  pointer pVVar5;
  size_type __n;
  VertexIter v_1;
  int i;
  SceneObject *output;
  Vector4D tmp;
  VertexIter v;
  Matrix4x4 transform;
  Matrix4x4 T;
  int j;
  int i_2;
  Matrix4x4 R_homogeneous;
  Matrix3x3 R;
  Matrix3x3 Rz;
  Matrix3x3 Ry;
  Matrix3x3 Rx;
  int i_1;
  Matrix4x4 S;
  Vector3D scale;
  Vector3D rotate;
  Vector3D position;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> originalPositions;
  HalfedgeMesh *in_stack_fffffffffffff9b8;
  Vector3D *in_stack_fffffffffffff9c0;
  Vector3D *in_stack_fffffffffffff9c8;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *in_stack_fffffffffffff9d0;
  Vector3D *in_stack_fffffffffffff9e8;
  Matrix4x4 *in_stack_fffffffffffff9f0;
  Matrix4x4 *in_stack_fffffffffffff9f8;
  undefined8 in_stack_fffffffffffffa10;
  undefined8 in_stack_fffffffffffffa18;
  _Self local_5a8;
  _Self local_5a0;
  int local_594;
  SceneObject *local_590;
  _List_node_base *local_588;
  double local_560;
  double local_558;
  Vector4D *in_stack_fffffffffffffab0;
  Matrix4x4 *in_stack_fffffffffffffab8;
  Vector3D local_510;
  Vector4D local_4f8;
  _Self local_4d8;
  _Self local_4d0 [5];
  Vertex *in_stack_fffffffffffffb58;
  Vector3D local_3c8 [4];
  BSDF *in_stack_fffffffffffffca0;
  HalfedgeMesh *in_stack_fffffffffffffca8;
  Mesh *in_stack_fffffffffffffcb0;
  int local_330;
  int local_32c;
  int local_214 [20];
  int local_1c4 [20];
  int local_174 [20];
  int local_124 [33];
  Vector3D local_a0;
  undefined8 local_88;
  Vector3D local_68;
  Vector3D local_40;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> local_28;
  
  std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::vector
            ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)0x202b05);
  Spline<CMU462::Vector3D>::operator()
            ((Spline<CMU462::Vector3D> *)in_stack_fffffffffffff9c8,(double)in_stack_fffffffffffff9c0
            );
  Spline<CMU462::Vector3D>::operator()
            ((Spline<CMU462::Vector3D> *)in_stack_fffffffffffff9c8,(double)in_stack_fffffffffffff9c0
            );
  local_88 = 0x3f91df46a2529d39;
  Vector3D::operator*(in_stack_fffffffffffff9c8,&in_stack_fffffffffffff9c0->x);
  Spline<CMU462::Vector3D>::operator()
            ((Spline<CMU462::Vector3D> *)in_stack_fffffffffffff9c8,(double)in_stack_fffffffffffff9c0
            );
  Matrix4x4::identity();
  for (local_124[0] = 0; local_124[0] < 3; local_124[0] = local_124[0] + 1) {
    pdVar3 = Vector3D::operator[](&local_a0,local_124);
    dVar1 = *pdVar3;
    pdVar3 = Matrix4x4::operator()
                       ((Matrix4x4 *)in_stack_fffffffffffff9c0,
                        (int)((ulong)in_stack_fffffffffffff9b8 >> 0x20),
                        (int)in_stack_fffffffffffff9b8);
    *pdVar3 = dVar1;
  }
  local_174[0] = 0;
  Vector3D::operator[](&local_68,local_174);
  rotateMatrix((float)((ulong)in_stack_fffffffffffffa18 >> 0x20),(float)in_stack_fffffffffffffa18,
               (float)((ulong)in_stack_fffffffffffffa10 >> 0x20),(float)in_stack_fffffffffffffa10);
  local_1c4[0] = 1;
  Vector3D::operator[](&local_68,local_1c4);
  rotateMatrix((float)((ulong)in_stack_fffffffffffffa18 >> 0x20),(float)in_stack_fffffffffffffa18,
               (float)((ulong)in_stack_fffffffffffffa10 >> 0x20),(float)in_stack_fffffffffffffa10);
  local_214[0] = 2;
  pdVar3 = Vector3D::operator[](&local_68,local_214);
  rotateMatrix((float)((ulong)pdVar3 >> 0x20),SUB84(pdVar3,0),
               (float)((ulong)in_stack_fffffffffffffa10 >> 0x20),(float)in_stack_fffffffffffffa10);
  Matrix3x3::operator*
            ((Matrix3x3 *)in_stack_fffffffffffff9f8,(Matrix3x3 *)in_stack_fffffffffffff9f0);
  Matrix3x3::operator*
            ((Matrix3x3 *)in_stack_fffffffffffff9f8,(Matrix3x3 *)in_stack_fffffffffffff9f0);
  Matrix4x4::identity();
  for (local_32c = 0; local_32c < 3; local_32c = local_32c + 1) {
    for (local_330 = 0; local_330 < 3; local_330 = local_330 + 1) {
      pdVar3 = Matrix3x3::operator()
                         ((Matrix3x3 *)in_stack_fffffffffffff9c0,
                          (int)((ulong)in_stack_fffffffffffff9b8 >> 0x20),
                          (int)in_stack_fffffffffffff9b8);
      dVar1 = *pdVar3;
      pdVar3 = Matrix4x4::operator()
                         ((Matrix4x4 *)in_stack_fffffffffffff9c0,
                          (int)((ulong)in_stack_fffffffffffff9b8 >> 0x20),
                          (int)in_stack_fffffffffffff9b8);
      *pdVar3 = dVar1;
    }
  }
  Vector3D::Vector3D(local_3c8,&local_40);
  Matrix4x4::translation(in_stack_fffffffffffff9e8);
  Matrix4x4::operator*(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
  Matrix4x4::operator*(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
  local_4d0[0]._M_node = (_List_node_base *)HalfedgeMesh::verticesBegin(in_stack_fffffffffffff9b8);
  while( true ) {
    local_4d8._M_node = (_List_node_base *)HalfedgeMesh::verticesEnd(in_stack_fffffffffffff9b8);
    bVar2 = std::operator!=(local_4d0,&local_4d8);
    if (!bVar2) break;
    std::_List_iterator<CMU462::Vertex>::operator->
              ((_List_iterator<CMU462::Vertex> *)in_stack_fffffffffffff9c0);
    std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::push_back
              (in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
    std::_List_iterator<CMU462::Vertex>::operator->
              ((_List_iterator<CMU462::Vertex> *)in_stack_fffffffffffff9c0);
    std::_List_iterator<CMU462::Vertex>::operator->
              ((_List_iterator<CMU462::Vertex> *)in_stack_fffffffffffff9c0);
    std::_List_iterator<CMU462::Vertex>::operator->
              ((_List_iterator<CMU462::Vertex> *)in_stack_fffffffffffff9c0);
    Vertex::normal(in_stack_fffffffffffffb58);
    CMU462::operator*(&in_stack_fffffffffffff9c8->x,in_stack_fffffffffffff9c0);
    Vector3D::operator+(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
    Vector4D::Vector4D(&local_4f8,&local_510,1.0);
    Matrix4x4::operator*(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
    Vector4D::to3D((Vector4D *)in_stack_fffffffffffff9b8);
    pVVar5 = std::_List_iterator<CMU462::Vertex>::operator->
                       ((_List_iterator<CMU462::Vertex> *)in_stack_fffffffffffff9c0);
    (pVVar5->position).x = local_560;
    (pVVar5->position).y = local_558;
    (pVVar5->position).z = (double)in_stack_fffffffffffffab0;
    local_588 = (_List_node_base *)std::_List_iterator<CMU462::Vertex>::operator++(local_4d0,0);
  }
  pSVar4 = (SceneObject *)operator_new(0x38);
  StaticScene::Mesh::Mesh
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
  local_594 = 0;
  local_590 = pSVar4;
  this_00 = HalfedgeMesh::verticesBegin(in_stack_fffffffffffff9b8);
  local_5a0._M_node = this_00._M_node;
  while( true ) {
    local_5a8._M_node = (_List_node_base *)HalfedgeMesh::verticesEnd(in_stack_fffffffffffff9b8);
    bVar2 = std::operator!=(&local_5a0,&local_5a8);
    if (!bVar2) break;
    __n = (size_type)local_594;
    local_594 = local_594 + 1;
    this_01 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                        (&local_28,__n);
    pVVar5 = std::_List_iterator<CMU462::Vertex>::operator->
                       ((_List_iterator<CMU462::Vertex> *)this_01);
    (pVVar5->position).x = this_01->x;
    (pVVar5->position).y = this_01->y;
    (pVVar5->position).z = this_01->z;
    std::_List_iterator<CMU462::Vertex>::operator++(&local_5a0,0);
  }
  std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::~vector
            ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)this_00._M_node);
  return local_590;
}

Assistant:

StaticScene::SceneObject *Mesh::get_transformed_static_object(double t) {
  vector<Vector3D> originalPositions;

  Vector3D position = positions(t);
  Vector3D rotate = rotations(t) * (PI / 180.);
  Vector3D scale = scales(t);

  Matrix4x4 S = Matrix4x4::identity();
  for (int i = 0; i < 3; i++) S(i, i) = scale[i];

  Matrix3x3 Rx = rotateMatrix(1, 0, 0, rotate[0]);
  Matrix3x3 Ry = rotateMatrix(0, 1, 0, rotate[1]);
  Matrix3x3 Rz = rotateMatrix(0, 0, 1, rotate[2]);

  Matrix3x3 R = Rx * Ry * Rz;
  Matrix4x4 R_homogeneous = Matrix4x4::identity();
  for (int i = 0; i < 3; i++) {
    for (int j = 0; j < 3; j++) {
      R_homogeneous(i, j) = R(i, j);
    }
  }

  Matrix4x4 T = Matrix4x4::translation(position);

  Matrix4x4 transform = T * R_homogeneous * S;

  for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
    originalPositions.push_back(v->position);
    Vector4D tmp = Vector4D(v->position + v->offset * v->normal(), 1.0);
    v->position = (transform * tmp).to3D();
  }

  StaticScene::SceneObject *output = new StaticScene::Mesh(mesh, bsdf);

  int i = 0;
  for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
    v->position = originalPositions[i++];
  }

  return output;
}